

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  luaK_exp2anyreg(fs,e);
  uVar1 = (e->u).info;
  if (((uVar1 & 0x100) == 0 && e->k == VNONRELOC) && ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + 0xff;
  }
  *(uint *)&e->u = (uint)fs->freereg;
  e->k = VNONRELOC;
  luaK_checkstack(fs,2);
  fs->freereg = fs->freereg + '\x02';
  iVar2 = (e->u).info;
  iVar3 = luaK_exp2RK(fs,key);
  luaK_code(fs,uVar1 << 0x17 | iVar2 << 6 | iVar3 << 0xe | 0xc);
  if (((key->k == VNONRELOC) && (((uint)(key->u).info >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (key->u).info)) {
    fs->freereg = fs->freereg + 0xff;
  }
  return;
}

Assistant:

void luaK_self(FuncState *fs, expdesc *e, expdesc *key) {
    int ereg;
    luaK_exp2anyreg(fs, e);
    ereg = e->u.info;  /* register where 'e' was placed */
    freeexp(fs, e);
    e->u.info = fs->freereg;  /* base register for op_self */
    e->k = VNONRELOC;  /* self expression has a fixed register */
    luaK_reserveregs(fs, 2);  /* function and 'self' produced by op_self */
    luaK_codeABC(fs, OP_SELF, e->u.info, ereg, luaK_exp2RK(fs, key));
    freeexp(fs, key);
}